

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

void __thiscall pstore::uuid::uuid(uuid *this)

{
  byte bVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  variant_type vVar4;
  undefined1 extraout_AL;
  undefined1 extraout_AH;
  undefined2 extraout_var;
  long lVar5;
  
  (this->data_)._M_elems[0] = '\0';
  (this->data_)._M_elems[1] = '\0';
  (this->data_)._M_elems[2] = '\0';
  (this->data_)._M_elems[3] = '\0';
  (this->data_)._M_elems[4] = '\0';
  (this->data_)._M_elems[5] = '\0';
  (this->data_)._M_elems[6] = '\0';
  (this->data_)._M_elems[7] = '\0';
  (this->data_)._M_elems[8] = '\0';
  (this->data_)._M_elems[9] = '\0';
  (this->data_)._M_elems[10] = '\0';
  (this->data_)._M_elems[0xb] = '\0';
  (this->data_)._M_elems[0xc] = '\0';
  (this->data_)._M_elems[0xd] = '\0';
  (this->data_)._M_elems[0xe] = '\0';
  (this->data_)._M_elems[0xf] = '\0';
  if (uuid()::random == '\0') {
    __cxa_guard_acquire(&uuid()::random);
    if ((CONCAT22(extraout_var,CONCAT11(extraout_AH,extraout_AL)) &
        CONCAT22(extraout_var,CONCAT11(extraout_AH,extraout_AL))) != 0) {
      random_generator<unsigned_short>::random_generator(&uuid::random);
      __cxa_atexit(random_generator<unsigned_short>::~random_generator,&uuid::random,&__dso_handle);
      __cxa_guard_release(&uuid()::random);
    }
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&uuid::mutex);
  if (iVar3 == 0) {
    lVar5 = 0;
    do {
      rVar2 = std::uniform_int_distribution<unsigned_short>::operator()
                        (&uuid::random.distribution_,&uuid::random.generator_,
                         &uuid::random.distribution_._M_param);
      (this->data_)._M_elems[lVar5] = (char)(rVar2 / 0xff) + (char)rVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    pthread_mutex_unlock((pthread_mutex_t *)&uuid::mutex);
    bVar1 = (this->data_)._M_elems[6];
    (this->data_)._M_elems[8] = (this->data_)._M_elems[8] & 0x3f | 0x80;
    (this->data_)._M_elems[6] = bVar1 & 0xf | 0x40;
    vVar4 = variant(this);
    if (vVar4 == rfc_4122) {
      if (((this->data_)._M_elems[6] & 0xf0) == 0x40) {
        return;
      }
      assert_failed("this->version () == uuid::version_type::random_number_based",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                    ,0x5c);
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  assert_failed("this->variant () == uuid::variant_type::rfc_4122",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                ,0x5b);
}

Assistant:

uuid::uuid () {
        {
            static std::mutex mutex;
            static random_generator<unsigned short> random;
            std::lock_guard<std::mutex> _{mutex};
            std::generate (std::begin (data_), std::end (data_), [] () {
                return static_cast<std::uint8_t> (random.get () %
                                                  std::numeric_limits<std::uint8_t>::max ());
            });
        }

        // Set variant: must be 0b10xxxxxx
        data_[variant_octet] &= 0b10111111;
        data_[variant_octet] |= 0b10000000;

        // Set version: must be 0b0100xxxx
        data_[version_octet] &= 0x4F; // 0b01001111;
        data_[version_octet] |= static_cast<std::uint8_t> (version_type::random_number_based) << 4;

        PSTORE_ASSERT (this->variant () == uuid::variant_type::rfc_4122);
        PSTORE_ASSERT (this->version () == uuid::version_type::random_number_based);
    }